

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_window.c
# Opt level: O0

ugui_window_t * menu_window_create(uint32_t w,uint32_t h)

{
  ugui_layer_t *layer;
  ugui_layer_t *child;
  ugui_layer_t *widget_layer;
  ugui_layer_t *base_layer;
  ugui_menu_widget_data_callbacks_t example_callbacks;
  uint32_t h_local;
  uint32_t w_local;
  
  menu_window = ugui_window_create(w,h);
  example_callbacks.select._0_2_ = 0;
  example_callbacks.select._2_2_ = 0;
  example_callbacks.select._4_2_ = (undefined2)w;
  example_callbacks.select._6_2_ = (undefined2)h;
  menu_widget = ugui_menu_widget_create
                          ((ugui_rect_t)
                           ((ulong)CONCAT22(example_callbacks.select._6_2_,
                                            example_callbacks.select._4_2_) << 0x20));
  base_layer = (ugui_layer_t *)example_menu_get_num_sections;
  example_callbacks.get_num_sections = example_menu_get_num_rows;
  example_callbacks.get_num_rows = example_menu_get_header;
  example_callbacks.get_header = example_menu_get_data;
  example_callbacks.get_data = example_menu_select;
  ugui_menu_widget_set_callbacks(menu_widget,(ugui_menu_widget_data_callbacks_t *)&base_layer);
  layer = ugui_window_get_base_layer(menu_window);
  child = ugui_menu_widget_get_layer(menu_widget);
  ugui_layer_add_child(layer,child);
  ugui_menu_widget_attach_to_window(menu_widget,menu_window);
  line_test_window = line_window_create(w,h);
  ugui_window_set_event_handler(line_test_window,demo_handle_event,(void *)0x0);
  circle_test_window = circle_window_create(w,h);
  ugui_window_set_event_handler(circle_test_window,demo_handle_event,(void *)0x0);
  layer_test_window = layer_window_create(w,h);
  ugui_window_set_event_handler(layer_test_window,demo_handle_event,(void *)0x0);
  text_test_window = text_window_create(w,h);
  ugui_window_set_event_handler(text_test_window,demo_handle_event,(void *)0x0);
  return menu_window;
}

Assistant:

ugui_window_t *menu_window_create(uint32_t w, uint32_t h)
{
	menu_window = ugui_window_create(w, h);


	//Setup widget
	menu_widget = ugui_menu_widget_create((ugui_rect_t) {
		.w = w,
		.h = h
	});

	ugui_menu_widget_data_callbacks_t example_callbacks;
	example_callbacks.get_num_sections = example_menu_get_num_sections;
	example_callbacks.get_num_rows = example_menu_get_num_rows;
	example_callbacks.get_header = example_menu_get_header;
	example_callbacks.get_data = example_menu_get_data;
	example_callbacks.select = example_menu_select;

	ugui_menu_widget_set_callbacks(menu_widget, &example_callbacks);


	//Bind widget to layer and window context
	ugui_layer_t* base_layer = ugui_window_get_base_layer(menu_window);

	ugui_layer_t* widget_layer = ugui_menu_widget_get_layer(menu_widget);

	ugui_layer_add_child(base_layer, widget_layer);

	ugui_menu_widget_attach_to_window(menu_widget, menu_window);


	//Create child layers
	line_test_window = line_window_create(w, h);
	ugui_window_set_event_handler(line_test_window, demo_handle_event, NULL);

	circle_test_window = circle_window_create(w, h);
	ugui_window_set_event_handler(circle_test_window, demo_handle_event, NULL);

	layer_test_window = layer_window_create(w, h);
	ugui_window_set_event_handler(layer_test_window, demo_handle_event, NULL);

	text_test_window = text_window_create(w, h);
	ugui_window_set_event_handler(text_test_window, demo_handle_event, NULL);

	return menu_window;
}